

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

EnumDef * __thiscall flatbuffers::Parser::LookupEnum(Parser *this,string *id)

{
  EnumDef *pEVar1;
  string *id_local;
  Parser *this_local;
  
  pEVar1 = anon_unknown_0::LookupTableByName<flatbuffers::EnumDef>
                     (&this->enums_,id,this->current_namespace_,0);
  return pEVar1;
}

Assistant:

EnumDef *Parser::LookupEnum(const std::string &id) {
  // Search thru parent namespaces.
  return LookupTableByName(enums_, id, *current_namespace_, 0);
}